

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O0

void lrc_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  xc_func_type *in_RDI;
  char *name;
  double par;
  double dVar1;
  double omega;
  double beta;
  double alpha;
  
  name = (char *)get_ext_param(in_RDI,(double *)in_RSI,0);
  par = get_ext_param(in_RDI,(double *)in_RSI,1);
  dVar1 = get_ext_param(in_RDI,(double *)in_RSI,2);
  *in_RDI->mix_coef = -par;
  xc_func_set_ext_params_name(in_RSI,name,par);
  in_RDI->cam_alpha = (double)name;
  in_RDI->cam_beta = par;
  in_RDI->cam_omega = dVar1;
  return;
}

Assistant:

static void
lrc_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega;

  assert(p != NULL);

  alpha = get_ext_param(p, ext_params, 0);
  beta  = get_ext_param(p, ext_params, 1);
  omega = get_ext_param(p, ext_params, 2);

  /* DFT part */
  p->mix_coef[0] = -beta;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* Set the hybrid flags */
  p->cam_alpha = alpha;
  p->cam_beta  = beta;
  p->cam_omega = omega;
}